

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_ignoreOtherParametersMultipleCallsButOneDidntHappen_Test::testBody
          (TEST_MockParameterTest_ignoreOtherParametersMultipleCallsButOneDidntHappen_Test *this)

{
  int iVar1;
  MockCheckedExpectedCall *pMVar2;
  UtestShell *test;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  SimpleString local_138;
  SimpleString local_128;
  SimpleString local_118;
  SimpleString local_108;
  SimpleString local_f8;
  SimpleString local_e8;
  SimpleString local_d8;
  undefined1 local_c8 [8];
  MockExpectedCallsDidntHappenFailure expectedFailure;
  SimpleString local_50;
  MockCheckedExpectedCall *local_40;
  MockCheckedExpectedCall *call;
  undefined1 local_28 [8];
  MockExpectedCallsListForTest expectations;
  MockFailureReporterInstaller failureReporterInstaller;
  TEST_MockParameterTest_ignoreOtherParametersMultipleCallsButOneDidntHappen_Test *this_local;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)
             ((long)&expectations.super_MockExpectedCallsList.head_ + 7));
  MockExpectedCallsListForTest::MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_28);
  SimpleString::SimpleString(&local_50,"boo");
  pMVar2 = MockExpectedCallsListForTest::addFunction
                     ((MockExpectedCallsListForTest *)local_28,&local_50);
  SimpleString::~SimpleString(&local_50);
  local_40 = pMVar2;
  (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[9])();
  (*(local_40->super_MockExpectedCall)._vptr_MockExpectedCall[0x36])(local_40,1);
  (*(local_40->super_MockExpectedCall)._vptr_MockExpectedCall[0x39])();
  (*(local_40->super_MockExpectedCall)._vptr_MockExpectedCall[9])();
  SimpleString::SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_,"boo");
  pMVar2 = MockExpectedCallsListForTest::addFunction
                     ((MockExpectedCallsListForTest *)local_28,
                      (SimpleString *)
                      &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[9])();
  SimpleString::~SimpleString
            ((SimpleString *)
             &expectedFailure.super_MockFailure.super_TestFailure.message_.bufferSize_);
  test = mockFailureTest();
  MockExpectedCallsDidntHappenFailure::MockExpectedCallsDidntHappenFailure
            ((MockExpectedCallsDidntHappenFailure *)local_c8,test,(MockExpectedCallsList *)local_28)
  ;
  SimpleString::SimpleString(&local_d8,"");
  pMVar3 = mock(&local_d8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_e8,"boo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_e8);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x48))();
  SimpleString::~SimpleString(&local_e8);
  SimpleString::~SimpleString(&local_d8);
  SimpleString::SimpleString(&local_f8,"");
  pMVar3 = mock(&local_f8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_108,"boo");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,&local_108);
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x48))();
  SimpleString::~SimpleString(&local_108);
  SimpleString::~SimpleString(&local_f8);
  SimpleString::SimpleString(&local_118,"");
  pMVar3 = mock(&local_118,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_128,"boo");
  (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_128);
  SimpleString::~SimpleString(&local_128);
  SimpleString::~SimpleString(&local_118);
  SimpleString::SimpleString(&local_138,"");
  pMVar3 = mock(&local_138,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_138);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)local_c8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockParameterTest.cpp"
             ,0x25f);
  MockExpectedCallsDidntHappenFailure::~MockExpectedCallsDidntHappenFailure
            ((MockExpectedCallsDidntHappenFailure *)local_c8);
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)local_28);
  MockFailureReporterInstaller::~MockFailureReporterInstaller
            ((MockFailureReporterInstaller *)
             ((long)&expectations.super_MockExpectedCallsList.head_ + 7));
  return;
}

Assistant:

TEST(MockParameterTest, ignoreOtherParametersMultipleCallsButOneDidntHappen)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    MockCheckedExpectedCall* call = expectations.addFunction("boo");
    call->ignoreOtherParameters();
    call->callWasMade(1);
    call->finalizeActualCallMatch();
    call->ignoreOtherParameters();
    expectations.addFunction("boo")->ignoreOtherParameters();
    MockExpectedCallsDidntHappenFailure expectedFailure(mockFailureTest(), expectations);

    mock().expectOneCall("boo").ignoreOtherParameters();
    mock().expectOneCall("boo").ignoreOtherParameters();
    mock().actualCall("boo");

    mock().checkExpectations();
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}